

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O0

vector<unsigned_long,_std::allocator<unsigned_long>_> *
mxx::gatherv<unsigned_long>
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          unsigned_long *data,size_t size,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *recv_sizes,int root,comm *comm)

{
  int iVar1;
  int iVar2;
  const_iterator __first;
  const_iterator __last;
  reference out;
  size_t total_size;
  comm *comm_local;
  int root_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *recv_sizes_local;
  size_t size_local;
  unsigned_long *data_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *result;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(__return_storage_ptr__);
  __first = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(recv_sizes);
  __last = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(recv_sizes);
  iVar1 = std::
          accumulate<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,int>
                    ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )__first._M_current,
                     (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )__last._M_current,0);
  iVar2 = mxx::comm::rank(comm);
  if (iVar2 == root) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (__return_storage_ptr__,(long)iVar1);
  }
  out = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                  (__return_storage_ptr__,0);
  gatherv<unsigned_long>(data,size,out,recv_sizes,root,comm);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> gatherv(const T* data, size_t size, const std::vector<size_t>& recv_sizes, int root, const mxx::comm& comm = mxx::comm()) {
    std::vector<T> result;
    size_t total_size = std::accumulate(recv_sizes.begin(), recv_sizes.end(), 0);
    if (comm.rank() == root)
        result.resize(total_size);
    gatherv(data, size, &result[0], recv_sizes, root, comm);
    return result;
}